

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

void Vec_PtrCopy(Vec_Ptr_t *pDest,Vec_Ptr_t *pSour)

{
  int iVar1;
  void **__ptr;
  int iVar2;
  
  pDest->nSize = 0;
  iVar1 = pSour->nSize;
  __ptr = pDest->pArray;
  iVar2 = iVar1;
  if (pDest->nCap < iVar1) {
    if (__ptr == (void **)0x0) {
      __ptr = (void **)malloc((long)iVar1 << 3);
    }
    else {
      __ptr = (void **)realloc(__ptr,(long)iVar1 << 3);
      iVar2 = pSour->nSize;
    }
    pDest->pArray = __ptr;
    pDest->nCap = iVar1;
  }
  memcpy(__ptr,pSour->pArray,(long)iVar2 << 3);
  pDest->nSize = pSour->nSize;
  return;
}

Assistant:

static inline void Vec_PtrCopy( Vec_Ptr_t * pDest, Vec_Ptr_t * pSour )
{
    pDest->nSize = 0;
    Vec_PtrGrow( pDest, pSour->nSize );
    memcpy( pDest->pArray, pSour->pArray, sizeof(void *) * pSour->nSize );
    pDest->nSize = pSour->nSize;
}